

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_coletree.c
# Opt level: O0

int * TreePostorder(int n,int *parent)

{
  int iVar1;
  int *first_kid_00;
  int *next_kid_00;
  int *post_00;
  int local_38;
  int dad;
  int v;
  int postnum;
  int *post;
  int *next_kid;
  int *first_kid;
  int *parent_local;
  int n_local;
  
  first_kid_00 = mxCallocInt(n + 1);
  next_kid_00 = mxCallocInt(n + 1);
  post_00 = mxCallocInt(n + 1);
  local_38 = 0;
  while (local_38 <= n) {
    first_kid_00[local_38] = -1;
    local_38 = local_38 + 1;
  }
  for (local_38 = n + -1; -1 < local_38; local_38 = local_38 + -1) {
    iVar1 = parent[local_38];
    next_kid_00[local_38] = first_kid_00[iVar1];
    first_kid_00[iVar1] = local_38;
  }
  nr_etdfs(n,parent,first_kid_00,next_kid_00,post_00,0);
  superlu_free(first_kid_00);
  superlu_free(next_kid_00);
  return post_00;
}

Assistant:

int *TreePostorder(
		   int n,
		   int *parent
		   )
{
        int	*first_kid, *next_kid;	/* Linked list of children.	*/
        int	*post, postnum;
	int	v, dad;

	/* Allocate storage for working arrays and results	*/
	first_kid = 	mxCallocInt (n+1);
	next_kid  = 	mxCallocInt (n+1);
	post	  = 	mxCallocInt (n+1);

	/* Set up structure describing children */
	for (v = 0; v <= n; first_kid[v++] = -1);
	for (v = n-1; v >= 0; v--) {
		dad = parent[v];
		next_kid[v] = first_kid[dad];
		first_kid[dad] = v;
	}

	/* Depth-first search from dummy root vertex #n */
	postnum = 0;
#if 0
	/* recursion */
	etdfs (n, first_kid, next_kid, post, &postnum);
#else
	/* no recursion */
	nr_etdfs(n, parent, first_kid, next_kid, post, postnum);
#endif

	SUPERLU_FREE (first_kid);
	SUPERLU_FREE (next_kid);
	return post;
}